

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void unroll(lua_State *L,void *ud)

{
  byte *pbVar1;
  uint uVar2;
  CallInfo *ci;
  lua_KFunction p_Var3;
  TString *pTVar4;
  long lVar5;
  int iVar6;
  TValue *io;
  StkId pSVar7;
  byte bVar8;
  uint uVar9;
  
  ci = L->ci;
  while (ci != &L->base_ci) {
    uVar2 = ci->callstatus;
    if ((short)uVar2 < 0) {
      if ((uVar2 >> 0x11 & 1) == 0) {
        p_Var3 = (ci->u).c.k;
        uVar9 = 1;
        if ((uVar2 >> 0x15 & 1) != 0) {
          uVar9 = 1;
          if ((uVar2 & 0x7000) != 0) {
            iVar6 = (ci->u2).funcidx;
            L->allowhook = (byte)(uVar2 >> 0x13) & 1;
            uVar9 = uVar2 >> 0xc & 7;
            pSVar7 = luaF_close(L,(StkId)((long)iVar6 + (long)(L->stack).p),(TStatus)uVar9,1);
            if (((byte)(uVar2 >> 0xc) & 7) == 4) {
              pTVar4 = L->l_G->memerrmsg;
              (pSVar7->val).value_.gc = (GCObject *)pTVar4;
              bVar8 = pTVar4->tt | 0x40;
            }
            else {
              lVar5 = (L->top).offset;
              (pSVar7->val).value_ = *(Value *)(lVar5 + -0x10);
              bVar8 = *(byte *)(lVar5 + -8);
            }
            (pSVar7->val).tt_ = bVar8;
            (L->top).p = pSVar7 + 1;
            luaD_shrinkstack(L);
            pbVar1 = (byte *)((long)&ci->callstatus + 1);
            *pbVar1 = *pbVar1 & 0x8f;
          }
          pbVar1 = (byte *)((long)&ci->callstatus + 2);
          *pbVar1 = *pbVar1 & 0xdf;
          L->errfunc = (ci->u).c.old_errfunc;
        }
        if ((L->ci->top).p < (L->top).p) {
          (L->ci->top).p = (L->top).p;
        }
        iVar6 = (*p_Var3)(L,uVar9,(ci->u).c.ctx);
      }
      else {
        iVar6 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar6);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
    ci = L->ci;
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}